

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::EnumFirstLastMethod::checkArguments
          (EnumFirstLastMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *unaff_retaddr;
  bool in_stack_0000000f;
  ASTContext *in_stack_00000010;
  SystemSubroutine *in_stack_00000018;
  SourceRange in_stack_00000020;
  Compilation *comp;
  undefined8 local_8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0xaf0586);
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000018,in_stack_00000010,in_stack_0000000f,unaff_retaddr,
                     in_stack_00000020,(size_t)context,(size_t)this);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    local_8 = not_null<const_slang::ast::Type_*>::operator*
                        ((not_null<const_slang::ast::Type_*> *)0xaf0604);
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        return *args[0]->type;
    }